

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLin>
                 *this,GetterXsYs<int> *getter1,GetterXsYs<int> *getter2,
                TransformerLogLin *transformer,ImU32 col)

{
  ImVec2 IVar1;
  int iVar2;
  ImPlotPlot *pIVar3;
  GetterXsYs<int> *pGVar4;
  TransformerLogLin *pTVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  double dVar8;
  double dVar9;
  ImPlotContext *pIVar10;
  int iVar11;
  long lVar12;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter1->Count;
  iVar11 = getter2->Count;
  if (iVar2 < getter2->Count) {
    iVar11 = iVar2;
  }
  this->Prims = iVar11 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar10 = GImPlot;
  (this->P12).y = 0.0;
  lVar12 = (long)((getter1->Offset % iVar2 + iVar2) % iVar2) * (long)getter1->Stride;
  iVar2 = *(int *)((long)getter1->Ys + lVar12);
  dVar8 = log10((double)*(int *)((long)getter1->Xs + lVar12) /
                (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar3 = pIVar10->CurrentPlot;
  dVar9 = (pIVar3->XAxis).Range.Min;
  iVar11 = transformer->YAxis;
  IVar1 = pIVar10->PixelRange[iVar11].Min;
  IVar6.y = (float)(pIVar10->My[iVar11] * ((double)iVar2 - pIVar3->YAxis[iVar11].Range.Min) +
                   (double)IVar1.y);
  IVar6.x = (float)(pIVar10->Mx *
                    (((double)(float)(dVar8 / pIVar10->LogDenX) *
                      ((pIVar3->XAxis).Range.Max - dVar9) + dVar9) - dVar9) + (double)IVar1.x);
  this->P11 = IVar6;
  pIVar10 = GImPlot;
  pGVar4 = this->Getter2;
  pTVar5 = this->Transformer;
  iVar2 = pGVar4->Count;
  lVar12 = (long)((pGVar4->Offset % iVar2 + iVar2) % iVar2) * (long)pGVar4->Stride;
  iVar2 = *(int *)((long)pGVar4->Ys + lVar12);
  dVar8 = log10((double)*(int *)((long)pGVar4->Xs + lVar12) /
                (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar3 = pIVar10->CurrentPlot;
  dVar9 = (pIVar3->XAxis).Range.Min;
  iVar11 = pTVar5->YAxis;
  IVar1 = pIVar10->PixelRange[iVar11].Min;
  IVar7.y = (float)(pIVar10->My[iVar11] * ((double)iVar2 - pIVar3->YAxis[iVar11].Range.Min) +
                   (double)IVar1.y);
  IVar7.x = (float)(pIVar10->Mx *
                    (((double)(float)(dVar8 / pIVar10->LogDenX) *
                      ((pIVar3->XAxis).Range.Max - dVar9) + dVar9) - dVar9) + (double)IVar1.x);
  this->P12 = IVar7;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }